

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowControllerType::~IfcFlowControllerType(IfcFlowControllerType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionFlowElementType).
                              super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
            super_IfcElementType.field_0x168 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x8f0908;
  *(undefined8 *)((long)pvVar1 + 0x48) = 0x8f09d0;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8f0930;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8f0958;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x8f0980;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8f09a8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__008f04d8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcFlowControllerType() : Object("IfcFlowControllerType") {}